

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WriteTVaR
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype_tvar,
          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail)

{
  pointer pTVar1;
  int strLen;
  _Rb_tree_node_base *p_Var2;
  pointer pTVar3;
  pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> s;
  char buffer [4096];
  pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> local_1058;
  char local_1038 [4104];
  
  for (p_Var2 = (tail->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(tail->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>::pair
              (&local_1058,
               (pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> *)(p_Var2 + 1));
    pTVar1 = local_1058.second.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar3 = local_1058.second.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
      local_1038[0] = '\0';
      strLen = snprintf(local_1038,0x1000,"%d,%d,%d,%f,%f\n",pTVar3->retperiod,(double)pTVar3->tvar,
                        (ulong)(uint)local_1058.first,(ulong)(uint)epcalc,(ulong)(uint)eptype_tvar);
      OutputRows(this,fileIDs,local_1038,strLen);
    }
    std::_Vector_base<TVaR,_std::allocator<TVaR>_>::~_Vector_base
              (&local_1058.second.super__Vector_base<TVaR,_std::allocator<TVaR>_>);
  }
  return;
}

Assistant:

void aggreports::WriteTVaR(const std::vector<int> &fileIDs, const int epcalc,
			   const int eptype_tvar,
			   const std::map<int, std::vector<TVaR>> &tail) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;

  for (auto s : tail) {
    for (auto t : s.second) {
      buffer[0] = 0;
      strLen = snprintf(buffer, bufferSize, "%d,%d,%d,%f,%f\n", s.first,
			epcalc, eptype_tvar, t.retperiod, t.tvar);
      OutputRows(fileIDs, buffer, strLen);
    }
  }

}